

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wu_2009.h
# Opt level: O0

void __thiscall SAUF<TTA>::PerformLabeling(SAUF<TTA> *this)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uchar *puVar4;
  uint *puVar5;
  uint *img_row_end;
  uint *img_row_start;
  int r_1;
  int c;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row_prev;
  uchar *img_row;
  int r;
  int local_84;
  Size local_80;
  Mat_<int> local_78;
  int local_18;
  int local_14;
  int w;
  int h;
  SAUF<TTA> *this_local;
  
  local_14 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  local_18 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  _w = this;
  cv::MatSize::operator()((MatSize *)&local_80);
  local_84 = 0;
  cv::Mat_<int>::Mat_(&local_78,&local_80,&local_84);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_78)
  ;
  cv::Mat_<int>::~Mat_(&local_78);
  TTA::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1) /
             2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc +
                   1) / 2) + 1);
  TTA::Setup();
  for (img_row._0_4_ = 0; (int)img_row < local_14; img_row._0_4_ = (int)img_row + 1) {
    puVar4 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar5 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (img_row_start._4_4_ = 0; img_row_start._4_4_ < local_18;
        img_row_start._4_4_ = img_row_start._4_4_ + 1) {
      if (puVar4[img_row_start._4_4_] != '\0') {
        if (((int)img_row < 1) || (puVar4[img_row_start._4_4_ - lVar1] == '\0')) {
          if ((img_row_start._4_4_ < local_18 + -1) &&
             ((0 < (int)img_row && (puVar4[(img_row_start._4_4_ + 1) - lVar1] != '\0')))) {
            if (((img_row_start._4_4_ < 1) || ((int)img_row < 1)) ||
               (puVar4[(img_row_start._4_4_ + -1) - lVar1] == '\0')) {
              if ((img_row_start._4_4_ < 1) || (puVar4[img_row_start._4_4_ + -1] == '\0')) {
                puVar5[img_row_start._4_4_] =
                     *(uint *)((long)puVar5 + ((long)(img_row_start._4_4_ + 1) * 4 - lVar2));
              }
              else {
                uVar3 = TTA::Merge(puVar5[img_row_start._4_4_ + -1],
                                   *(uint *)((long)puVar5 +
                                            ((long)(img_row_start._4_4_ + 1) * 4 - lVar2)));
                puVar5[img_row_start._4_4_] = uVar3;
              }
            }
            else {
              uVar3 = TTA::Merge(*(uint *)((long)puVar5 +
                                          ((long)(img_row_start._4_4_ + -1) * 4 - lVar2)),
                                 *(uint *)((long)puVar5 +
                                          ((long)(img_row_start._4_4_ + 1) * 4 - lVar2)));
              puVar5[img_row_start._4_4_] = uVar3;
            }
          }
          else if ((img_row_start._4_4_ < 1) ||
                  (((int)img_row < 1 || (puVar4[(img_row_start._4_4_ + -1) - lVar1] == '\0')))) {
            if ((img_row_start._4_4_ < 1) || (puVar4[img_row_start._4_4_ + -1] == '\0')) {
              uVar3 = TTA::NewLabel();
              puVar5[img_row_start._4_4_] = uVar3;
            }
            else {
              puVar5[img_row_start._4_4_] = puVar5[img_row_start._4_4_ + -1];
            }
          }
          else {
            puVar5[img_row_start._4_4_] =
                 *(uint *)((long)puVar5 + ((long)(img_row_start._4_4_ + -1) * 4 - lVar2));
          }
        }
        else {
          puVar5[img_row_start._4_4_] =
               *(uint *)((long)puVar5 + ((long)img_row_start._4_4_ * 4 - lVar2));
        }
      }
    }
  }
  uVar3 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar3;
  for (img_row_start._0_4_ = 0;
      (int)img_row_start <
      *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      img_row_start._0_4_ = (int)img_row_start + 1) {
    img_row_end = cv::Mat::ptr<unsigned_int>
                            (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                              super_Mat,(int)img_row_start);
    puVar5 = img_row_end +
             *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
    for (; img_row_end != puVar5; img_row_end = img_row_end + 1) {
      uVar3 = TTA::GetLabel(*img_row_end);
      *img_row_end = uVar3;
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size(), 0); // Allocation + initialization of the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#include "labeling_wu_2009_tree.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }

        LabelsSolver::Dealloc(); // Memory deallocation of the labels solver

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }